

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,StuntDouble *sd,SelectionSet *bs,int property,int comparator,
          float comparisonValue,int frame)

{
  double *pdVar1;
  ulong *puVar2;
  SnapshotManager *pSVar3;
  Atom *atom_00;
  double dVar4;
  RealType RVar5;
  uint i;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  int iVar8;
  Atom *atom;
  _func_int **pp_Var9;
  double dVar10;
  Vector3d pos;
  Vector3d local_68;
  double local_48 [3];
  
  local_68.super_Vector<double,_3U>.data_[0] = 0.0;
  local_68.super_Vector<double,_3U>.data_[1] = 0.0;
  local_68.super_Vector<double,_3U>.data_[2] = 0.0;
  switch(property) {
  case 0x1c00:
    dVar4 = sd->mass_;
    break;
  case 0x1c01:
    if (sd->objType_ < otRigidBody) {
      dVar4 = getCharge(this,(Atom *)sd,frame);
    }
    else {
      dVar4 = 0.0;
      if ((sd->objType_ == otRigidBody) &&
         (pp_Var9 = (_func_int **)sd[2].mass_, dVar4 = 0.0,
         pp_Var9 != sd[2].properties_._vptr_PropertyMap)) {
        atom_00 = (Atom *)*pp_Var9;
        dVar4 = 0.0;
        while (atom_00 != (Atom *)0x0) {
          pp_Var9 = pp_Var9 + 1;
          RVar5 = getCharge(this,atom_00,frame);
          dVar4 = RVar5 + dVar4;
          if (pp_Var9 == sd[2].properties_._vptr_PropertyMap) break;
          atom_00 = (Atom *)*pp_Var9;
        }
      }
    }
    break;
  case 0x1c02:
    iVar6 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    dVar4 = *(double *)
             (*(long *)(CONCAT44(extraout_var_00,iVar6) + sd->storage_) +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c03:
    iVar6 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    dVar4 = *(double *)
             (*(long *)(CONCAT44(extraout_var_01,iVar6) + sd->storage_) + 8 +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c04:
    iVar6 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    dVar4 = *(double *)
             (*(long *)(CONCAT44(extraout_var,iVar6) + sd->storage_) + 0x10 +
             (long)sd->localIndex_ * 0x18);
    break;
  case 0x1c05:
    iVar6 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    lVar7 = *(long *)(CONCAT44(extraout_var_04,iVar6) + sd->storage_);
    pdVar1 = (double *)(lVar7 + (long)sd->localIndex_ * 0x18);
    local_48[0] = *pdVar1;
    local_48[1] = pdVar1[1];
    local_48[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)sd->localIndex_ * 0x18);
    dVar4 = 0.0;
    lVar7 = 0;
    do {
      dVar4 = dVar4 + local_48[lVar7] * local_48[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    break;
  case 0x1c06:
    iVar6 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    lVar7 = *(long *)(CONCAT44(extraout_var_05,iVar6) + sd->storage_);
    local_68.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar7 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar7 + (long)sd->localIndex_ * 0x18);
    local_68.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_68.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    pSVar3 = this->info->sman_;
    iVar6 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_06,iVar6),&local_68);
    dVar4 = local_68.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c07:
    iVar6 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    lVar7 = *(long *)(CONCAT44(extraout_var_02,iVar6) + sd->storage_);
    local_68.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar7 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar7 + (long)sd->localIndex_ * 0x18);
    local_68.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_68.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    pSVar3 = this->info->sman_;
    iVar6 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_03,iVar6),&local_68);
    dVar4 = local_68.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c08:
    iVar6 = (*sd->snapshotMan_->_vptr_SnapshotManager[4])(sd->snapshotMan_,(ulong)(uint)frame);
    lVar7 = *(long *)(CONCAT44(extraout_var_07,iVar6) + sd->storage_);
    local_68.super_Vector<double,_3U>.data_[2] =
         *(double *)(lVar7 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar7 + (long)sd->localIndex_ * 0x18);
    local_68.super_Vector<double,_3U>.data_[0] = *pdVar1;
    local_68.super_Vector<double,_3U>.data_[1] = pdVar1[1];
    pSVar3 = this->info->sman_;
    iVar6 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_08,iVar6),&local_68);
    dVar4 = local_68.super_Vector<double,_3U>.data_[2];
    break;
  case 0x1c09:
    dVar4 = 0.0;
    if (sd->objType_ < otRigidBody) {
      dVar4 = (double)sd->globalIndex_;
    }
    break;
  default:
    unrecognizedAtomProperty(this,property);
    dVar4 = 0.0;
  }
  switch(comparator) {
  case 0x3400:
    if (dVar4 <= (double)comparisonValue) {
      return;
    }
    break;
  case 0x3401:
    if (dVar4 < (double)comparisonValue) {
      return;
    }
    break;
  case 0x3402:
    dVar10 = (double)comparisonValue;
    goto LAB_0026e15c;
  case 0x3403:
    if ((double)comparisonValue <= dVar4) {
      return;
    }
    break;
  case 0x3404:
    dVar4 = ABS(dVar4 - (double)comparisonValue);
    dVar10 = 1e-06;
LAB_0026e15c:
    if (dVar10 < dVar4) {
      return;
    }
    break;
  case 0x3405:
    if ((dVar4 == (double)comparisonValue) && (!NAN(dVar4) && !NAN((double)comparisonValue))) {
      return;
    }
    break;
  default:
    goto switchD_0026e121_default;
  }
  iVar6 = sd->globalIndex_;
  iVar8 = iVar6 + 0x3f;
  if (-1 < (long)iVar6) {
    iVar8 = iVar6;
  }
  puVar2 = (ulong *)((long)(iVar8 >> 6) * 8 +
                     *(long *)&(((bs->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + -8 +
                    (ulong)(((long)iVar6 & 0x800000000000003fU) < 0x8000000000000001) * 8);
  *puVar2 = *puVar2 | 1L << ((byte)iVar6 & 0x3f);
switchD_0026e121_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(StuntDouble* sd, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue, int frame) {
    RealType propertyValue = 0.0;
    Vector3d pos;
    switch (property) {
    case Token::atomno:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = atom->getGlobalIndex();
      }
      break;
    case Token::mass:
      propertyValue = sd->getMass();
      break;
    case Token::charge:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = getCharge(atom, frame);
      } else if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        RigidBody::AtomIterator ai;
        Atom* atom;
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          propertyValue += getCharge(atom, frame);
        }
      }
      break;
    case Token::x:
      propertyValue = sd->getPos(frame).x();
      break;
    case Token::y:
      propertyValue = sd->getPos(frame).y();
      break;
    case Token::z:
      propertyValue = sd->getPos(frame).z();
      break;
    case Token::wrappedX:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.z();
      break;

    case Token::r:
      propertyValue = sd->getPos(frame).length();
      break;
    default:
      unrecognizedAtomProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }
    if (match) bs.bitsets_[STUNTDOUBLE].setBitOn(sd->getGlobalIndex());
  }